

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O2

void mk_sched_worker_cb_free(mk_server *server)

{
  mk_list *pmVar1;
  mk_list *pmVar2;
  mk_list *pmVar3;
  
  pmVar3 = (server->sched_worker_callbacks).next;
  while (pmVar3 != &server->sched_worker_callbacks) {
    pmVar1 = pmVar3->prev;
    pmVar2 = pmVar3->next;
    pmVar1->next = pmVar2;
    pmVar2->prev = pmVar1;
    pmVar3->prev = (mk_list *)0x0;
    pmVar3->next = (mk_list *)0x0;
    free(pmVar3 + -1);
    pmVar3 = pmVar2;
  }
  return;
}

Assistant:

void mk_sched_worker_cb_free(struct mk_server *server)
{
    struct mk_list *tmp;
    struct mk_list *head;
    struct mk_sched_worker_cb *wcb;

    mk_list_foreach_safe(head, tmp, &server->sched_worker_callbacks) {
        wcb = mk_list_entry(head, struct mk_sched_worker_cb, _head);
        mk_list_del(&wcb->_head);
        mk_mem_free(wcb);
    }
}